

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathMatrix3.cpp
# Opt level: O1

Real __thiscall COLLADABU::Math::Matrix3::spectralNorm(Matrix3 *this)

{
  long lVar1;
  double *pdVar2;
  Real *pRVar3;
  Real *pRVar4;
  long lVar5;
  long lVar6;
  Real RVar7;
  double dVar8;
  double dVar9;
  Matrix3 kP;
  Real afCoeff [3];
  double local_60 [9];
  double local_18;
  double local_10;
  double local_8;
  
  dVar8 = 0.0;
  lVar1 = 0;
  pRVar3 = (Real *)this;
  do {
    lVar5 = 0;
    pRVar4 = (Real *)this;
    dVar9 = dVar8;
    do {
      local_60[lVar1 * 3 + lVar5] = 0.0;
      dVar8 = 0.0;
      lVar6 = 0;
      do {
        dVar8 = dVar8 + *(double *)((long)pRVar3 + lVar6) * *(double *)((long)pRVar4 + lVar6);
        lVar6 = lVar6 + 0x18;
      } while (lVar6 != 0x48);
      local_60[lVar1 * 3 + lVar5] = dVar8;
      if (dVar8 <= dVar9) {
        dVar8 = dVar9;
      }
      lVar5 = lVar5 + 1;
      pRVar4 = pRVar4 + 1;
      dVar9 = dVar8;
    } while (lVar5 != 3);
    lVar1 = lVar1 + 1;
    pRVar3 = pRVar3 + 1;
  } while (lVar1 != 3);
  pdVar2 = local_60;
  lVar1 = 0;
  do {
    lVar5 = 0;
    do {
      pdVar2[lVar5] = pdVar2[lVar5] * (1.0 / dVar8);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar1 = lVar1 + 1;
    pdVar2 = pdVar2 + 3;
  } while (lVar1 != 3);
  local_18 = -((local_60[7] * local_60[3] - local_60[4] * local_60[6]) * local_60[2] +
              (local_60[4] * local_60[8] - local_60[5] * local_60[7]) * local_60[0] +
              (local_60[5] * local_60[6] - local_60[8] * local_60[3]) * local_60[1]);
  local_10 = (((local_60[0] * local_60[8] + (local_60[0] * local_60[4] - local_60[3] * local_60[1]))
              - local_60[2] * local_60[6]) + local_60[4] * local_60[8]) - local_60[5] * local_60[7];
  local_8 = -(local_60[0] + local_60[4] + local_60[8]);
  RVar7 = maxCubicRoot(&local_18);
  dVar8 = dVar8 * RVar7;
  if (0.0 <= dVar8) {
    return SQRT(dVar8);
  }
  dVar8 = sqrt(dVar8);
  return dVar8;
}

Assistant:

Real Matrix3::spectralNorm () const
        {
            Matrix3 kP;
            size_t iRow, iCol;
            Real fPmax = 0.0;

            for ( iRow = 0; iRow < 3; iRow++ )
            {
                for ( iCol = 0; iCol < 3; iCol++ )
                {
                    kP[ iRow ][ iCol ] = 0.0;

                    for ( int iMid = 0; iMid < 3; iMid++ )
                    {
                        kP[ iRow ][ iCol ] +=
                            m[ iMid ][ iRow ] * m[ iMid ][ iCol ];
                    }

                    if ( kP[ iRow ][ iCol ] > fPmax )
                        fPmax = kP[ iRow ][ iCol ];
                }
            }

            Real fInvPmax = 1.0 / fPmax;

            for ( iRow = 0; iRow < 3; iRow++ )
            {
                for ( iCol = 0; iCol < 3; iCol++ )
                    kP[ iRow ][ iCol ] *= fInvPmax;
            }

            Real afCoeff[ 3 ];
            afCoeff[ 0 ] = -( kP[ 0 ][ 0 ] * ( kP[ 1 ][ 1 ] * kP[ 2 ][ 2 ] - kP[ 1 ][ 2 ] * kP[ 2 ][ 1 ] ) +
                              kP[ 0 ][ 1 ] * ( kP[ 2 ][ 0 ] * kP[ 1 ][ 2 ] - kP[ 1 ][ 0 ] * kP[ 2 ][ 2 ] ) +
                              kP[ 0 ][ 2 ] * ( kP[ 1 ][ 0 ] * kP[ 2 ][ 1 ] - kP[ 2 ][ 0 ] * kP[ 1 ][ 1 ] ) );
            afCoeff[ 1 ] = kP[ 0 ][ 0 ] * kP[ 1 ][ 1 ] - kP[ 0 ][ 1 ] * kP[ 1 ][ 0 ] +
                           kP[ 0 ][ 0 ] * kP[ 2 ][ 2 ] - kP[ 0 ][ 2 ] * kP[ 2 ][ 0 ] +
                           kP[ 1 ][ 1 ] * kP[ 2 ][ 2 ] - kP[ 1 ][ 2 ] * kP[ 2 ][ 1 ];
            afCoeff[ 2 ] = -( kP[ 0 ][ 0 ] + kP[ 1 ][ 1 ] + kP[ 2 ][ 2 ] );

            Real fRoot = maxCubicRoot( afCoeff );
            Real fNorm = sqrt( fPmax * fRoot );
            return fNorm;
        }